

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckh.c
# Opt level: O1

void ckh_delete(tsd_t *tsd,ckh_t *ckh)

{
  long *plVar1;
  rtree_ctx_cache_elm_t *prVar2;
  undefined8 *puVar3;
  ckhc_t *ptr;
  void *pvVar4;
  rtree_leaf_elm_t *prVar5;
  ulong uVar6;
  rtree_leaf_elm_t *prVar7;
  ulong uVar8;
  rtree_ctx_cache_elm_t *prVar9;
  rtree_ctx_cache_elm_t *prVar10;
  rtree_leaf_elm_t *prVar11;
  uint uVar12;
  rtree_ctx_t *prVar13;
  bool bVar14;
  rtree_ctx_t local_1b0;
  
  ptr = ckh->tab;
  if (tsd == (tsd_t *)0x0) {
    prVar13 = &local_1b0;
    rtree_ctx_data_init(prVar13);
  }
  else {
    prVar13 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar12 = (uint)((ulong)ptr >> 0x1e) & 0xf;
  prVar11 = (rtree_leaf_elm_t *)((ulong)ptr & 0xffffffffc0000000);
  uVar6 = (ulong)(uVar12 << 4);
  puVar3 = (undefined8 *)((long)&prVar13->cache[0].leafkey + uVar6);
  prVar7 = *(rtree_leaf_elm_t **)((long)&prVar13->cache[0].leafkey + uVar6);
  if (prVar7 == prVar11) {
    prVar7 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar3[1]);
  }
  else if ((rtree_leaf_elm_t *)prVar13->l2_cache[0].leafkey == prVar11) {
    prVar5 = prVar13->l2_cache[0].leaf;
    prVar13->l2_cache[0].leafkey = (uintptr_t)prVar7;
    prVar13->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar3[1];
    *puVar3 = prVar11;
    puVar3[1] = prVar5;
    prVar7 = (rtree_leaf_elm_t *)
             ((long)&(prVar5->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
  }
  else {
    prVar9 = prVar13->l2_cache + 1;
    if ((rtree_leaf_elm_t *)prVar13->l2_cache[1].leafkey == prVar11) {
      uVar8 = 0;
      bVar14 = false;
    }
    else {
      uVar6 = 1;
      prVar10 = prVar9;
      do {
        uVar8 = uVar6;
        bVar14 = 6 < uVar8;
        if (uVar8 == 7) goto LAB_0011c0a6;
        prVar9 = prVar10 + 1;
        prVar2 = prVar10 + 1;
        uVar6 = uVar8 + 1;
        prVar10 = prVar9;
      } while ((rtree_leaf_elm_t *)prVar2->leafkey != prVar11);
      bVar14 = 6 < uVar8;
    }
    prVar5 = prVar9->leaf;
    prVar9->leafkey = prVar13->l2_cache[uVar8].leafkey;
    prVar9->leaf = prVar13->l2_cache[uVar8].leaf;
    prVar13->l2_cache[uVar8].leafkey = (uintptr_t)prVar7;
    prVar13->l2_cache[uVar8].leaf = (rtree_leaf_elm_t *)puVar3[1];
    *puVar3 = prVar11;
    puVar3[1] = prVar5;
    prVar7 = (rtree_leaf_elm_t *)
             ((long)&(prVar5->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
LAB_0011c0a6:
    if (bVar14) {
      prVar7 = rtree_leaf_elm_lookup_hard
                         ((tsdn_t *)tsd,&extents_rtree,prVar13,(uintptr_t)ptr,true,false);
    }
  }
  pvVar4 = arenas[*(uint *)(((long)(prVar7->le_bits).repr << 0x10) >> 0x10 & 0xfffffffffffffffe) &
                  0xfff].repr;
  if (tsd == (tsd_t *)0x0) {
    prVar13 = &local_1b0;
    rtree_ctx_data_init(prVar13);
  }
  else {
    prVar13 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar6 = (ulong)(uVar12 << 4);
  puVar3 = (undefined8 *)((long)&prVar13->cache[0].leafkey + uVar6);
  prVar7 = *(rtree_leaf_elm_t **)((long)&prVar13->cache[0].leafkey + uVar6);
  if (prVar7 == prVar11) {
    prVar7 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar3[1]);
  }
  else if ((rtree_leaf_elm_t *)prVar13->l2_cache[0].leafkey == prVar11) {
    prVar5 = prVar13->l2_cache[0].leaf;
    prVar13->l2_cache[0].leafkey = (uintptr_t)prVar7;
    prVar13->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar3[1];
    *puVar3 = prVar11;
    puVar3[1] = prVar5;
    prVar7 = (rtree_leaf_elm_t *)
             ((long)&(prVar5->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
  }
  else {
    prVar9 = prVar13->l2_cache + 1;
    if ((rtree_leaf_elm_t *)prVar13->l2_cache[1].leafkey == prVar11) {
      uVar8 = 0;
      bVar14 = false;
    }
    else {
      uVar6 = 1;
      prVar10 = prVar9;
      do {
        uVar8 = uVar6;
        bVar14 = 6 < uVar8;
        if (uVar8 == 7) goto LAB_0011c12a;
        prVar9 = prVar10 + 1;
        prVar2 = prVar10 + 1;
        uVar6 = uVar8 + 1;
        prVar10 = prVar9;
      } while ((rtree_leaf_elm_t *)prVar2->leafkey != prVar11);
      bVar14 = 6 < uVar8;
    }
    prVar5 = prVar9->leaf;
    prVar9->leafkey = prVar13->l2_cache[uVar8].leafkey;
    prVar9->leaf = prVar13->l2_cache[uVar8].leaf;
    prVar13->l2_cache[uVar8].leafkey = (uintptr_t)prVar7;
    prVar13->l2_cache[uVar8].leaf = (rtree_leaf_elm_t *)puVar3[1];
    *puVar3 = prVar11;
    puVar3[1] = prVar5;
    prVar7 = (rtree_leaf_elm_t *)
             ((long)&(prVar5->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
LAB_0011c12a:
    if (bVar14) {
      prVar7 = rtree_leaf_elm_lookup_hard
                         ((tsdn_t *)tsd,&extents_rtree,prVar13,(uintptr_t)ptr,true,false);
    }
  }
  LOCK();
  plVar1 = (long *)((long)pvVar4 + 0x68);
  *plVar1 = *plVar1 - sz_index2size_tab[(ulong)(prVar7->le_bits).repr >> 0x30];
  UNLOCK();
  arena_dalloc_no_tcache((tsdn_t *)tsd,ptr);
  return;
}

Assistant:

void
ckh_delete(tsd_t *tsd, ckh_t *ckh) {
	assert(ckh != NULL);

#ifdef CKH_VERBOSE
	malloc_printf(
	    "%s(%p): ngrows: %"FMTu64", nshrinks: %"FMTu64","
	    " nshrinkfails: %"FMTu64", ninserts: %"FMTu64","
	    " nrelocs: %"FMTu64"\n", __func__, ckh,
	    (unsigned long long)ckh->ngrows,
	    (unsigned long long)ckh->nshrinks,
	    (unsigned long long)ckh->nshrinkfails,
	    (unsigned long long)ckh->ninserts,
	    (unsigned long long)ckh->nrelocs);
#endif

	idalloctm(tsd_tsdn(tsd), ckh->tab, NULL, NULL, true, true);
	if (config_debug) {
		memset(ckh, JEMALLOC_FREE_JUNK, sizeof(ckh_t));
	}
}